

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_parse_siblings(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  lyd_lyb_sibling *plVar2;
  bool bVar3;
  LY_VALUE_FORMAT LVar4;
  uint32_t flags;
  char *pcVar5;
  char *pcVar6;
  lyd_meta *module_key_00;
  lyd_ctx *name_00;
  char *module_key_01;
  char *value_00;
  LY_ERR ret___2;
  LY_ERR LVar7;
  undefined4 uVar8;
  LY_ERR LVar9;
  lysc_node *plVar10;
  size_t sVar11;
  size_t value_len;
  size_t name_len;
  byte bVar12;
  long lVar13;
  lys_module *mod_00;
  lylyb_ctx *plVar14;
  LYD_ANYDATA_VALUETYPE value_type;
  ly_ctx *ctx;
  lyd_node *plVar15;
  LY_ERR ret__;
  LY_ERR LVar16;
  ly_bool dynamic_1;
  char *name;
  ly_bool dynamic;
  uint8_t count;
  lyd_meta *meta;
  lyd_node *tree;
  lyd_node *local_110;
  char *value;
  lyd_meta *meta_1;
  lyd_meta *local_f8;
  lyd_ctx *local_f0;
  lyd_node *node_3;
  lyd_ctx *lydctx;
  ly_set *local_d8;
  lyd_node **local_d0;
  ly_ctx *local_c8;
  lyd_meta *local_c0;
  size_t local_b8;
  void *local_b0;
  undefined4 local_a4;
  ly_ctx *local_a0;
  lysc_node *snode;
  lys_module *mod;
  char *mod_name;
  void *val_prefix_data;
  char *module_key;
  char *prefix;
  char *name_1;
  char *value_1;
  undefined4 local_4c;
  ly_ctx *local_48;
  lylyb_ctx *local_40;
  size_t local_38;
  
  plVar2 = lybctx->lybctx->siblings;
  if (plVar2 == (lyd_lyb_sibling *)0x0) {
    local_a4 = 0;
  }
  else {
    local_a4 = (undefined4)
               CONCAT71((int7)((ulong)plVar2 >> 8),*(long *)&plVar2[-1].inner_chunks != 0);
  }
  LVar7 = lyb_read_start_siblings(lybctx->lybctx);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  uVar8 = 0;
  local_110 = parent;
  local_f0 = (lyd_ctx *)lybctx;
  local_d8 = parsed;
  local_d0 = first_p;
LAB_00138b8d:
  plVar2 = ((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx)->siblings;
  if (plVar2 == (lyd_lyb_sibling *)0x0) {
    lVar13 = -1;
  }
  else {
    lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
  }
  if (plVar2[lVar13].written != 0) {
    mod_name = (char *)0x0;
    mod = (lys_module *)0x0;
    local_4c = uVar8;
    lyb_read((uint8_t *)&mod,1,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
    if ((int)mod - 1U < 2) {
      plVar10 = lyd_parser_node_schema(parent);
      mod_00 = (lys_module *)0x0;
LAB_00138c43:
      LVar7 = lyb_parse_schema_hash(lybctx,plVar10,mod_00,&snode);
joined_r0x0013915e:
      if (LVar7 == LY_SUCCESS) {
LAB_00138c54:
        plVar10 = snode;
        if (snode == (lysc_node *)0x0) {
          LVar7 = LY_SUCCESS;
          node_3 = (lyd_node *)0x0;
          local_f8 = (lyd_meta *)0x0;
          value_1 = (char *)0x0;
          name_1 = (char *)0x0;
          prefix = (char *)0x0;
          module_key = (char *)0x0;
          dynamic = '\0';
          val_prefix_data = (void *)0x0;
          plVar14 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
          local_48 = plVar14->ctx;
          meta = (lyd_meta *)0x0;
          tree = (lyd_node *)0x0;
          meta_1 = (lyd_meta *)0x0;
          lydctx = (lyd_ctx *)0x0;
          value = (char *)0x0;
          dynamic_1 = '\0';
          local_b0 = (void *)0x0;
          lyb_read(&count,1,plVar14);
          if (count != '\0') {
            local_c0 = local_f8;
            uVar8 = 0;
            local_40 = plVar14;
            do {
              plVar14 = local_40;
              local_c8 = (ly_ctx *)CONCAT44(local_c8._4_4_,uVar8);
              LVar7 = lyb_read_string((char **)&tree,'\x02',local_40);
              if (LVar7 != LY_SUCCESS) goto LAB_00139341;
              if ((char)tree->hash == '\0') {
                free(tree);
                tree = (lyd_node *)0x0;
              }
              LVar9 = lyb_read_string((char **)&meta_1,'\x02',plVar14);
              LVar7 = LY_EMEM;
              if (LVar9 != LY_SUCCESS) goto LAB_00139341;
              if (*(char *)&meta_1->parent == '\0') {
                free(meta_1);
                meta_1 = (lyd_meta *)0x0;
              }
              LVar9 = lyb_read_string((char **)&lydctx,'\x02',plVar14);
              if (LVar9 != LY_SUCCESS) goto LAB_00139341;
              name = (char *)0x0;
              lyb_read((uint8_t *)&name,1,plVar14);
              LVar4 = (LYD_ANYDATA_VALUETYPE)name;
              LVar7 = lyb_parse_prefix_data(plVar14,(LYD_ANYDATA_VALUETYPE)name,&local_b0);
              parsed = local_d8;
              if (LVar7 != LY_SUCCESS) goto LAB_00139341;
              LVar7 = lyb_read_string(&value,'\b',plVar14);
              name_00 = lydctx;
              if (LVar7 != LY_SUCCESS) {
                local_f8 = local_c0;
                ly_free_prefix_data(LVar4,local_b0);
                LVar7 = LY_EMEM;
                parsed = local_d8;
                goto LAB_0013934b;
              }
              dynamic_1 = '\x01';
              local_a0 = plVar14->ctx;
              local_38 = strlen((char *)lydctx);
              plVar15 = tree;
              if (tree == (lyd_node *)0x0) {
                local_b8 = 0;
              }
              else {
                local_b8 = strlen((char *)tree);
              }
              module_key_00 = meta_1;
              if (meta_1 == (lyd_meta *)0x0) {
                sVar11 = 0;
              }
              else {
                sVar11 = strlen((char *)meta_1);
              }
              pcVar6 = value;
              if (value == (char *)0x0) {
                value_len = 0;
              }
              else {
                value_len = strlen(value);
              }
              LVar7 = lyd_create_attr((lyd_node *)0x0,(lyd_attr **)&meta,local_a0,(char *)name_00,
                                      local_38,(char *)plVar15,local_b8,(char *)module_key_00,sVar11
                                      ,pcVar6,value_len,&dynamic_1,LVar4,local_b0,0x3f3);
              plVar14 = local_40;
              lybctx = (lyd_lyb_ctx *)local_f0;
              parsed = local_d8;
              parent = local_110;
              first_p = local_d0;
              if (LVar7 != LY_SUCCESS) goto LAB_00139341;
              free(plVar15);
              tree = (lyd_node *)0x0;
              free(module_key_00);
              meta_1 = (lyd_meta *)0x0;
              free(name_00);
              lydctx = (lyd_ctx *)0x0;
              if (dynamic_1 != '\0') {
                local_f8 = local_c0;
                __assert_fail("!dynamic",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                              ,0x2af,
                              "LY_ERR lyb_parse_attributes(struct lylyb_ctx *, struct lyd_attr **)")
                ;
              }
              value = (char *)0x0;
              if (local_c0 == (lyd_meta *)0x0) {
                local_c0 = meta;
              }
              bVar12 = (char)local_c8 + 1;
              uVar8 = CONCAT31((int3)((ulong)local_c8 >> 8),bVar12);
              lybctx = (lyd_lyb_ctx *)local_f0;
              parsed = local_d8;
              parent = local_110;
              first_p = local_d0;
            } while (bVar12 < count);
            LVar7 = LY_SUCCESS;
            plVar14 = local_40;
LAB_00139341:
            local_f8 = local_c0;
          }
LAB_0013934b:
          free(tree);
          free(meta_1);
          free(lydctx);
          if (dynamic_1 != '\0') {
            free(value);
          }
          if (LVar7 == LY_SUCCESS) {
            name = (char *)0x0;
            lyb_read((uint8_t *)&name,4,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
            flags = (LYD_ANYDATA_VALUETYPE)name;
            LVar9 = lyb_read_string(&prefix,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
            LVar16 = LY_EMEM;
            LVar7 = LVar16;
            if (((LVar9 == LY_SUCCESS) &&
                (LVar9 = lyb_read_string(&module_key,'\x02',
                                         (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx),
                LVar9 == LY_SUCCESS)) &&
               (LVar9 = lyb_read_string(&name_1,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx),
               LVar9 == LY_SUCCESS)) {
              LVar9 = lyb_read_string(&value_1,'\b',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
              if (LVar9 == LY_SUCCESS) {
                dynamic = '\x01';
                name = (char *)0x0;
                lyb_read((uint8_t *)&name,1,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                LVar4 = (LYD_ANYDATA_VALUETYPE)name;
                LVar7 = lyb_parse_prefix_data
                                  ((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,
                                   (LYD_ANYDATA_VALUETYPE)name,&val_prefix_data);
                pcVar6 = name_1;
                parent = local_110;
                if (LVar7 == LY_SUCCESS) {
                  if ((((lyd_ctx *)lybctx)->parse_opts & 0x40000) == 0) {
                    LVar9 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                    parent = local_110;
                    LVar7 = LVar16;
                    if (LVar9 == LY_SUCCESS) {
                      lyb_skip_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                      LVar7 = lyb_read_stop_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                    }
                  }
                  else {
                    local_c8 = (ly_ctx *)strlen(name_1);
                    pcVar5 = prefix;
                    if (prefix == (char *)0x0) {
                      local_b8 = 0;
                    }
                    else {
                      local_b8 = strlen(prefix);
                    }
                    module_key_01 = module_key;
                    if (module_key == (char *)0x0) {
                      local_a0 = (ly_ctx *)0x0;
                    }
                    else {
                      local_a0 = (ly_ctx *)strlen(module_key);
                    }
                    value_00 = value_1;
                    sVar11 = strlen(value_1);
                    LVar7 = lyd_create_opaq(local_48,pcVar6,(size_t)local_c8,pcVar5,local_b8,
                                            module_key_01,(size_t)local_a0,value_00,sVar11,&dynamic,
                                            LVar4,val_prefix_data,0x3f3,&node_3);
                    first_p = local_d0;
                    parsed = local_d8;
                    lybctx = (lyd_lyb_ctx *)local_f0;
                    parent = local_110;
                    if (LVar7 == LY_SUCCESS) {
                      if (node_3 == (lyd_node *)0x0) {
                        __assert_fail("node",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x48f,
                                      "LY_ERR lyb_parse_node_opaq(struct lyd_lyb_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      ly_log_location((lysc_node *)0x0,node_3,(char *)0x0,(ly_in *)0x0);
                      LVar7 = lyb_parse_siblings(lybctx,node_3,(lyd_node **)0x0,(ly_set *)0x0);
                      if (LVar7 == LY_SUCCESS) {
                        lyb_finish_opaq(lybctx,parent,flags,(lyd_attr **)&local_f8,&node_3,first_p,
                                        parsed);
                        if (node_3 != (lyd_node *)0x0 || local_f8 != (lyd_meta *)0x0) {
                          __assert_fail("!attr && !node",
                                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                        ,0x498,
                                        "LY_ERR lyb_parse_node_opaq(struct lyd_lyb_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                                       );
                        }
                        LVar7 = LY_SUCCESS;
                        ly_log_location_revert(0,1,0,0);
                      }
                    }
                  }
                }
              }
              else {
                ly_free_prefix_data(LY_VALUE_CANON,val_prefix_data);
              }
            }
          }
          else {
            lyd_free_attr_siblings(plVar14->ctx,(lyd_attr *)local_f8);
            local_f8 = (lyd_meta *)0x0;
          }
          if (node_3 != (lyd_node *)0x0) {
            ly_log_location_revert(0,1,0,0);
          }
          free(prefix);
          free(module_key);
          free(name_1);
          if (dynamic != '\0') {
            free(value_1);
          }
          lyd_free_attr_siblings(local_48,(lyd_attr *)local_f8);
          plVar15 = node_3;
LAB_00139704:
          lyd_free_tree(plVar15);
        }
        else {
          uVar1 = snode->nodetype;
          if ((uVar1 & 8) == 0) {
            if (uVar1 == 0x10) {
              name = (char *)0x0;
              meta = (lyd_meta *)0x0;
              LVar7 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
              if (LVar7 == LY_SUCCESS) {
                while( true ) {
                  plVar14 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
                  plVar2 = plVar14->siblings;
                  if (plVar2 == (lyd_lyb_sibling *)0x0) {
                    lVar13 = -1;
                  }
                  else {
                    lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
                  }
                  if (plVar2[lVar13].written == 0) goto LAB_001391ba;
                  LVar7 = lyb_parse_node_header(lybctx,plVar10,(uint32_t *)&tree,&meta);
                  bVar3 = true;
                  if ((LVar7 != LY_SUCCESS) ||
                     (LVar7 = lyd_create_inner(plVar10,(lyd_node **)&name), LVar7 != LY_SUCCESS))
                  goto LAB_00139567;
                  if (name == (char *)0x0) {
                    __assert_fail("node",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                  ,0x5a9,
                                  "LY_ERR lyb_parse_node_list(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                                 );
                  }
                  ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                  LVar7 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0)
                  ;
                  parent = local_110;
                  if (LVar7 != LY_SUCCESS) {
                    bVar3 = false;
                    goto LAB_00139567;
                  }
                  LVar7 = LY_SUCCESS;
                  if ((((lyd_ctx *)lybctx)->parse_opts & 0x10000) == 0) {
                    LVar7 = lyd_parser_validate_new_implicit((lyd_ctx *)lybctx,(lyd_node *)name);
                  }
                  if (LVar7 != LY_SUCCESS) break;
                  if ((plVar10->nodetype & 0x700) != 0) {
                    ((lyd_ctx *)lybctx)->op_node = (lyd_node *)name;
                  }
                  lyb_finish_node(lybctx,parent,(uint32_t)tree,&meta,(lyd_node **)&name,first_p,
                                  parsed);
                  ly_log_location_revert(0,1,0,0);
                }
                bVar3 = false;
LAB_00139567:
                if (!bVar3) {
                  ly_log_location_revert(0,1,0,0);
                }
                lyd_free_meta_siblings(meta);
                lyd_free_tree((lyd_node *)name);
                parent = local_110;
              }
            }
            else if ((uVar1 & 0x60) == 0) {
              if ((uVar1 & 0x711) != 0) {
                name = (char *)0x0;
                meta = (lyd_meta *)0x0;
                LVar7 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&tree,&meta);
                if ((LVar7 == LY_SUCCESS) &&
                   (LVar7 = lyd_create_inner(plVar10,(lyd_node **)&name), LVar7 == LY_SUCCESS)) {
                  if (name == (char *)0x0) {
                    __assert_fail("node",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                  ,0x51f,
                                  "LY_ERR lyb_parse_node_inner(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                                 );
                  }
                  ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                  LVar7 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0)
                  ;
                  if (LVar7 == LY_SUCCESS) {
                    LVar7 = LY_SUCCESS;
                    if ((((lyd_ctx *)lybctx)->parse_opts & 0x10000) == 0) {
                      LVar7 = lyd_parser_validate_new_implicit((lyd_ctx *)lybctx,(lyd_node *)name);
                    }
                    if (LVar7 == LY_SUCCESS) {
                      if ((plVar10->nodetype & 0x700) != 0) {
                        ((lyd_ctx *)lybctx)->op_node = (lyd_node *)name;
                      }
                      lyb_finish_node(lybctx,parent,(uint32_t)tree,&meta,(lyd_node **)&name,first_p,
                                      parsed);
                      LVar7 = LY_SUCCESS;
                      ly_log_location_revert(0,1,0,0);
                      goto LAB_00139709;
                    }
                  }
                }
                if (name != (char *)0x0) {
                  ly_log_location_revert(0,1,0,0);
                }
                lyd_free_meta_siblings(meta);
                plVar15 = (lyd_node *)name;
                goto LAB_00139704;
              }
              LVar7 = lyb_parse_node_leaf(lybctx,parent,snode,first_p,parsed);
            }
            else {
              meta = (lyd_meta *)0x0;
              tree = (lyd_node *)0x0;
              meta_1 = (lyd_meta *)0x0;
              lydctx = (lyd_ctx *)0x0;
              value = (char *)0x0;
              ctx = ((lyd_ctx *)lybctx)->data_ctx->ctx;
              LVar7 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&local_b0,&meta_1);
              if (LVar7 == LY_SUCCESS) {
                name = (char *)0x0;
                lyb_read((uint8_t *)&name,4,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                value_type = (LYD_ANYDATA_VALUETYPE)name;
                if (((LYD_ANYDATA_VALUETYPE)name == LYD_ANYDATA_DATATREE) ||
                   (((LYD_ANYDATA_VALUETYPE)name != LYD_ANYDATA_LYB && (plVar10->nodetype == 0x60)))
                   ) {
LAB_001392e5:
                  LVar7 = LY_EINT;
                  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        );
                }
                else {
                  LVar9 = lyb_read_string(&value,'\b',(lylyb_ctx *)local_f0->data_ctx);
                  pcVar6 = value;
                  LVar7 = LY_EMEM;
                  if (LVar9 == LY_SUCCESS) {
                    if (value_type == LYD_ANYDATA_LYB) {
                      local_c8 = ctx;
                      LVar7 = ly_in_new_memory(value,(ly_in **)&name);
                      lybctx = (lyd_lyb_ctx *)local_f0;
                      parent = local_110;
                      if (LVar7 != LY_SUCCESS) goto LAB_00139709;
                      LVar7 = lyd_parse_lyb(local_c8,(lysc_ext_instance *)0x0,(lyd_node *)0x0,&tree,
                                            (ly_in *)name,0x70000,0,0x30,(ly_set *)0x0,
                                            (ly_bool *)0x0,&lydctx);
                      ly_in_free((ly_in *)name,'\0');
                      if (lydctx != (lyd_ctx *)0x0) {
                        (*lydctx->free)(lydctx);
                      }
                      if (LVar7 != LY_SUCCESS) {
                        lyd_free_siblings(tree);
                        goto LAB_0013953c;
                      }
                      free(pcVar6);
                      value = (char *)tree;
                      value_type = LYD_ANYDATA_DATATREE;
                      ctx = local_c8;
                    }
                    if (LYD_ANYDATA_JSON < value_type) goto LAB_001392e5;
                    LVar7 = lyd_create_any(plVar10,value,value_type,'\x01',(lyd_node **)&meta);
                    if (LVar7 == LY_SUCCESS) {
                      if (meta == (lyd_meta *)0x0) {
                        __assert_fail("node",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x4f4,
                                      "LY_ERR lyb_parse_node_any(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      LVar7 = LY_SUCCESS;
                      ly_log_location((lysc_node *)0x0,(lyd_node *)meta,(char *)0x0,(ly_in *)0x0);
                      lybctx = (lyd_lyb_ctx *)local_f0;
                      lyb_finish_node((lyd_lyb_ctx *)local_f0,local_110,(uint32_t)local_b0,&meta_1,
                                      (lyd_node **)&meta,first_p,parsed);
                      ly_log_location_revert(0,1,0,0);
                      parent = local_110;
                      goto LAB_00139709;
                    }
                  }
                }
              }
LAB_0013953c:
              free(value);
              lyd_free_meta_siblings(meta_1);
              lyd_free_tree((lyd_node *)meta);
              lybctx = (lyd_lyb_ctx *)local_f0;
              parent = local_110;
            }
          }
          else {
            LVar7 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
            while (LVar7 == LY_SUCCESS) {
              plVar14 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
              plVar2 = plVar14->siblings;
              if (plVar2 == (lyd_lyb_sibling *)0x0) {
                lVar13 = -1;
              }
              else {
                lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
              }
              if (plVar2[lVar13].written == 0) goto LAB_001391ba;
              LVar7 = lyb_parse_node_leaf(lybctx,parent,plVar10,first_p,parsed);
            }
          }
        }
      }
    }
    else if ((int)mod == 3) {
      LVar7 = lyb_read_model((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,&mod_name,(char *)&mod,
                             (ly_set *)0x0);
      pcVar6 = mod_name;
      if (LVar7 == LY_SUCCESS) {
        name = (char *)0x0;
        if (parent == (lyd_node *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x366,
                        "LY_ERR lyb_parse_schema_nested_ext(struct lyd_lyb_ctx *, const struct lyd_node *, const char *, const struct lysc_node **)"
                       );
        }
        LVar9 = lyb_read_string(&name,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
        LVar7 = LY_EMEM;
        if (LVar9 == LY_SUCCESS) {
          if (pcVar6 == (char *)0x0) {
            sVar11 = 0;
          }
          else {
            sVar11 = strlen(pcVar6);
          }
          pcVar5 = name;
          name_len = strlen(name);
          LVar7 = ly_nested_ext_schema
                            (local_110,(lysc_node *)0x0,pcVar6,sVar11,LY_VALUE_JSON,(void *)0x0,
                             pcVar5,name_len,&snode,(lysc_ext_instance **)&meta);
          first_p = local_d0;
          if (LVar7 == LY_SUCCESS) {
            lyb_cache_module_hash(snode->module);
            LVar7 = LY_SUCCESS;
            first_p = local_d0;
          }
          else if (LVar7 == LY_ENOT) {
            LVar7 = LY_EINVAL;
            ly_log(((lyd_ctx *)lybctx)->data_ctx->ctx,LY_LLERR,LY_EINVAL,
                   "Failed to parse node \"%s\" as nested extension instance data.",pcVar5);
          }
        }
        free(name);
        parent = local_110;
        goto joined_r0x0013915e;
      }
    }
    else {
      if ((int)mod != 0) goto LAB_00138c54;
      LVar7 = lyb_parse_model((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,
                              ((lyd_ctx *)lybctx)->parse_opts,'\0',&mod);
      if (LVar7 == LY_SUCCESS) {
        plVar10 = (lysc_node *)0x0;
        mod_00 = mod;
        goto LAB_00138c43;
      }
    }
    goto LAB_00139709;
  }
  goto LAB_00139a41;
LAB_001391ba:
  LVar7 = lyb_read_stop_siblings(plVar14);
LAB_00139709:
  free(mod_name);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  uVar8 = local_4c;
  if (((char)local_a4 == '\0') && ((((lyd_ctx *)lybctx)->int_opts & 0x20) == 0)) {
LAB_00139a41:
    LVar7 = lyb_read_stop_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
    return LVar7;
  }
  goto LAB_00138b8d;
}

Assistant:

static LY_ERR
lyb_parse_siblings(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    ly_bool top_level;

    top_level = !LY_ARRAY_COUNT(lybctx->lybctx->siblings);

    /* register a new siblings */
    LY_CHECK_RET(lyb_read_start_siblings(lybctx->lybctx));

    while (LYB_LAST_SIBLING(lybctx->lybctx).written) {
        LY_CHECK_RET(lyb_parse_node(lybctx, parent, first_p, parsed));

        if (top_level && !(lybctx->int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* end the siblings */
    LY_CHECK_RET(lyb_read_stop_siblings(lybctx->lybctx));

    return LY_SUCCESS;
}